

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddUtil.c
# Opt level: O0

DdGen * Cudd_zddFirstPath(DdManager *zdd,DdNode *f,int **path)

{
  int iVar1;
  DdNode *pDVar2;
  uint *puVar3;
  int local_4c;
  int nvars;
  int i;
  DdNode *prev;
  DdNode *next;
  DdNode *top;
  DdGen *gen;
  int **path_local;
  DdNode *f_local;
  DdManager *zdd_local;
  
  if ((zdd == (DdManager *)0x0) || (f == (DdNode *)0x0)) {
    zdd_local = (DdManager *)0x0;
  }
  else {
    zdd_local = (DdManager *)malloc(0x38);
    if (zdd_local == (DdManager *)0x0) {
      zdd->errorCode = CUDD_MEMORY_OUT;
      zdd_local = (DdManager *)0x0;
    }
    else {
      *(DdManager **)&zdd_local->sentinel = zdd;
      *(undefined4 *)&(zdd_local->sentinel).next = 3;
      *(undefined4 *)((long)&(zdd_local->sentinel).next + 4) = 0;
      (zdd_local->sentinel).type.value = 0.0;
      (zdd_local->sentinel).type.kids.E = (DdNode *)0x0;
      *(undefined4 *)&(zdd_local->sentinel).Id = 0;
      zdd_local->one = (DdNode *)0x0;
      zdd_local->zero = (DdNode *)0x0;
      iVar1 = zdd->sizeZ;
      pDVar2 = (DdNode *)malloc((long)iVar1 << 2);
      (zdd_local->sentinel).type.kids.T = pDVar2;
      if ((zdd_local->sentinel).type.kids.T == (DdNode *)0x0) {
        zdd->errorCode = CUDD_MEMORY_OUT;
        if (zdd_local != (DdManager *)0x0) {
          free(zdd_local);
        }
        zdd_local = (DdManager *)0x0;
      }
      else {
        for (local_4c = 0; local_4c < iVar1; local_4c = local_4c + 1) {
          (&((zdd_local->sentinel).type.kids.T)->index)[local_4c] = 2;
        }
        pDVar2 = (DdNode *)malloc((long)(iVar1 + 1) << 3);
        zdd_local->one = pDVar2;
        if (zdd_local->one == (DdNode *)0x0) {
          zdd->errorCode = CUDD_MEMORY_OUT;
          if ((zdd_local->sentinel).type.kids.T != (DdNode *)0x0) {
            free((zdd_local->sentinel).type.kids.T);
            (zdd_local->sentinel).type.value = 0.0;
          }
          if (zdd_local != (DdManager *)0x0) {
            free(zdd_local);
          }
          zdd_local = (DdManager *)0x0;
        }
        else {
          for (local_4c = 0; local_4c <= iVar1; local_4c = local_4c + 1) {
            *(undefined8 *)(&zdd_local->one->index + (long)local_4c * 2) = 0;
          }
          *(DdNode **)(&zdd_local->one->index + (long)(int)(zdd_local->sentinel).Id * 2) = f;
          *(int *)&(zdd_local->sentinel).Id = (int)(zdd_local->sentinel).Id + 1;
          while( true ) {
            while (next = *(DdNode **)
                           (&zdd_local->one->index + (long)((int)(zdd_local->sentinel).Id + -1) * 2)
                  , *(int *)((ulong)next & 0xfffffffffffffffe) != 0x7fffffff) {
              (&((zdd_local->sentinel).type.kids.T)->index)
              [*(uint *)((ulong)next & 0xfffffffffffffffe)] = 0;
              *(ulong *)(&zdd_local->one->index + (long)(int)(zdd_local->sentinel).Id * 2) =
                   *(ulong *)(((ulong)next & 0xfffffffffffffffe) + 0x18) ^ 1;
              *(int *)&(zdd_local->sentinel).Id = (int)(zdd_local->sentinel).Id + 1;
            }
            if ((DdNode *)((ulong)next & 0xfffffffffffffffe) != zdd->zero) break;
            while( true ) {
              if ((int)(zdd_local->sentinel).Id == 1) {
                *(undefined4 *)((long)&(zdd_local->sentinel).next + 4) = 0;
                *(int *)&(zdd_local->sentinel).Id = (int)(zdd_local->sentinel).Id + -1;
                goto LAB_00a4be57;
              }
              puVar3 = (uint *)(*(ulong *)(&zdd_local->one->index +
                                          (long)((int)(zdd_local->sentinel).Id + -2) * 2) &
                               0xfffffffffffffffe);
              pDVar2 = *(DdNode **)(puVar3 + 4);
              if (pDVar2 != next) break;
              (&((zdd_local->sentinel).type.kids.T)->index)[*puVar3] = 2;
              *(int *)&(zdd_local->sentinel).Id = (int)(zdd_local->sentinel).Id + -1;
              next = *(DdNode **)
                      (&zdd_local->one->index + (long)((int)(zdd_local->sentinel).Id + -1) * 2);
            }
            (&((zdd_local->sentinel).type.kids.T)->index)[*puVar3] = 1;
            *(DdNode **)(&zdd_local->one->index + (long)((int)(zdd_local->sentinel).Id + -1) * 2) =
                 pDVar2;
          }
          *(undefined4 *)((long)&(zdd_local->sentinel).next + 4) = 1;
          (zdd_local->sentinel).type.kids.E =
               *(DdNode **)(((ulong)next & 0xfffffffffffffffe) + 0x10);
LAB_00a4be57:
          *path = (int *)(zdd_local->sentinel).type.value;
        }
      }
    }
  }
  return (DdGen *)zdd_local;
}

Assistant:

DdGen *
Cudd_zddFirstPath(
  DdManager * zdd,
  DdNode * f,
  int ** path)
{
    DdGen *gen;
    DdNode *top, *next, *prev;
    int i;
    int nvars;

    /* Sanity Check. */
    if (zdd == NULL || f == NULL) return(NULL);

    /* Allocate generator an initialize it. */
    gen = ABC_ALLOC(DdGen,1);
    if (gen == NULL) {
        zdd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }

    gen->manager = zdd;
    gen->type = CUDD_GEN_ZDD_PATHS;
    gen->status = CUDD_GEN_EMPTY;
    gen->gen.cubes.cube = NULL;
    gen->gen.cubes.value = DD_ZERO_VAL;
    gen->stack.sp = 0;
    gen->stack.stack = NULL;
    gen->node = NULL;

    nvars = zdd->sizeZ;
    gen->gen.cubes.cube = ABC_ALLOC(int,nvars);
    if (gen->gen.cubes.cube == NULL) {
        zdd->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(gen);
        return(NULL);
    }
    for (i = 0; i < nvars; i++) gen->gen.cubes.cube[i] = 2;

    /* The maximum stack depth is one plus the number of variables.
    ** because a path may have nodes at all levels, including the
    ** constant level.
    */
    gen->stack.stack = ABC_ALLOC(DdNodePtr, nvars+1);
    if (gen->stack.stack == NULL) {
        zdd->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(gen->gen.cubes.cube);
        ABC_FREE(gen);
        return(NULL);
    }
    for (i = 0; i <= nvars; i++) gen->stack.stack[i] = NULL;

    /* Find the first path of the ZDD. */
    gen->stack.stack[gen->stack.sp] = f; gen->stack.sp++;

    while (1) {
        top = gen->stack.stack[gen->stack.sp-1];
        if (!cuddIsConstant(Cudd_Regular(top))) {
            /* Take the else branch first. */
            gen->gen.cubes.cube[Cudd_Regular(top)->index] = 0;
            next = cuddE(Cudd_Regular(top));
            gen->stack.stack[gen->stack.sp] = Cudd_Not(next); gen->stack.sp++;
        } else if (Cudd_Regular(top) == DD_ZERO(zdd)) {
            /* Backtrack. */
            while (1) {
                if (gen->stack.sp == 1) {
                    /* The current node has no predecessor. */
                    gen->status = CUDD_GEN_EMPTY;
                    gen->stack.sp--;
                    goto done;
                }
                prev = Cudd_Regular(gen->stack.stack[gen->stack.sp-2]);
                next = cuddT(prev);
                if (next != top) { /* follow the then branch next */
                    gen->gen.cubes.cube[prev->index] = 1;
                    gen->stack.stack[gen->stack.sp-1] = next;
                    break;
                }
                /* Pop the stack and try again. */
                gen->gen.cubes.cube[prev->index] = 2;
                gen->stack.sp--;
                top = gen->stack.stack[gen->stack.sp-1];
            }
        } else {
            gen->status = CUDD_GEN_NONEMPTY;
            gen->gen.cubes.value = cuddV(Cudd_Regular(top));
            goto done;
        }
    }

done:
    *path = gen->gen.cubes.cube;
    return(gen);

}